

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvrogencppTests.cc
# Opt level: O0

void testEncoding2<umu::r1>(void)

{
  r1 *this;
  element_type *peVar1;
  type pEVar2;
  r1 *this_00;
  element_type *peVar3;
  r1 t2;
  auto_ptr<avro::InputStream> is;
  DecoderPtr d;
  r1 t1;
  EncoderPtr e;
  auto_ptr<avro::OutputStream> os;
  ifstream ifs;
  ValidSchema s;
  r1 *in_stack_fffffffffffffd08;
  Encoder *in_stack_fffffffffffffd10;
  r1 local_2d8;
  OutputStream local_2a8 [24];
  shared_ptr<avro::Decoder> local_290;
  r1 local_280;
  shared_ptr<avro::Encoder> local_240;
  auto_ptr<avro::OutputStream> local_230 [24];
  istream local_218 [520];
  ValidSchema local_10 [16];
  
  avro::ValidSchema::ValidSchema(local_10);
  std::ifstream::ifstream(local_218,"jsonschemas/union_map_union",_S_in);
  avro::compileJsonSchema(local_218,local_10);
  avro::memoryOutputStream((ulong)local_230);
  avro::binaryEncoder();
  avro::validatingEncoder((ValidSchema *)&local_240,(shared_ptr *)local_10);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x25f3b5);
  this = (r1 *)boost::shared_ptr<avro::Encoder>::operator->(&local_240);
  peVar1 = std::auto_ptr<avro::OutputStream>::operator*(local_230);
  (**(code **)(*(long *)&this->id + 0x10))(this,peVar1);
  umu::r1::r1(this);
  setRecord(&local_280);
  boost::shared_ptr<avro::Encoder>::operator*(&local_240);
  avro::encode<umu::r1>(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  pEVar2 = boost::shared_ptr<avro::Encoder>::operator->(&local_240);
  (**(code **)(*(long *)pEVar2 + 0x18))();
  avro::binaryDecoder();
  avro::validatingDecoder((ValidSchema *)&local_290,(shared_ptr *)local_10);
  boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x25f468);
  std::auto_ptr<avro::OutputStream>::operator*(local_230);
  avro::memoryInputStream(local_2a8);
  this_00 = (r1 *)boost::shared_ptr<avro::Decoder>::operator->(&local_290);
  peVar3 = std::auto_ptr<avro::InputStream>::operator*((auto_ptr<avro::InputStream> *)local_2a8);
  (**(code **)(*(long *)&this_00->id + 0x10))(this_00,peVar3);
  umu::r1::r1(this);
  boost::shared_ptr<avro::Decoder>::operator*(&local_290);
  avro::decode<umu::r1>((Decoder *)this_00,in_stack_fffffffffffffd08);
  check(&local_2d8,&local_280);
  umu::r1::~r1(this_00);
  std::auto_ptr<avro::InputStream>::~auto_ptr((auto_ptr<avro::InputStream> *)this_00);
  boost::shared_ptr<avro::Decoder>::~shared_ptr((shared_ptr<avro::Decoder> *)0x25f502);
  umu::r1::~r1(this_00);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x25f519);
  std::auto_ptr<avro::OutputStream>::~auto_ptr((auto_ptr<avro::OutputStream> *)this_00);
  std::ifstream::~ifstream(local_218);
  avro::ValidSchema::~ValidSchema((ValidSchema *)0x25f540);
  return;
}

Assistant:

void testEncoding2()
{
    ValidSchema s;
    ifstream ifs(schemaFilename<T>::value);
    compileJsonSchema(ifs, s);

    auto_ptr<OutputStream> os = memoryOutputStream();
    EncoderPtr e = validatingEncoder(s, binaryEncoder());
    e->init(*os);
    T t1;
    setRecord(t1);
    avro::encode(*e, t1);
    e->flush();

    DecoderPtr d = validatingDecoder(s, binaryDecoder());
    auto_ptr<InputStream> is = memoryInputStream(*os);
    d->init(*is);
    T t2;
    avro::decode(*d, t2);

    check(t2, t1);
}